

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void responsive_thread(void)

{
  pointer *ppuVar1;
  unsigned_long uVar2;
  mapped_type *pmVar3;
  vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
  *this;
  mapped_type *pmVar4;
  anon_class_1_0_00000001_for_m_object *__args_1;
  in_place_t *extraout_RDX;
  in_place_t *extraout_RDX_00;
  in_place_t *__args;
  int iVar5;
  iterator __position;
  bool bVar6;
  key_type local_9c;
  vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
  *local_98 [2];
  code *local_88;
  code *local_80;
  code *local_78;
  code *local_70;
  undefined1 local_68;
  code *local_50;
  undefined8 local_48;
  bool local_38;
  
  local_9c = 0xd;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&handlebars::dispatcher<int>::m_unused_handler_storage_indices,&local_9c)
  ;
  __args_1 = (anon_class_1_0_00000001_for_m_object *)
             (pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (__args_1 ==
      (anon_class_1_0_00000001_for_m_object *)
      (pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::__detail::
    _Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&handlebars::dispatcher<int>::m_handler_map,&local_9c);
    this = (vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
            *)std::__detail::
              _Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&handlebars::dispatcher<int>::m_handler_map,&local_9c);
    __position._M_current = *(optional<tmf::callable<void_(),_32UL>_> **)(this + 8);
    __args = extraout_RDX_00;
    if (__position._M_current != *(pointer *)(this + 0x10)) {
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload._M_value.m_empty =
           false;
      *(code **)((long)&((__position._M_current)->
                        super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>)._M_payload
                        .super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
                        super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload +
                0x38) =
           tmf::detail::
           member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18),_void_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18)::*)()_const,_void>
           ::anon_class_1_0_00000001_for_m_object::operator();
      *(undefined8 *)
       ((long)&((__position._M_current)->
               super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>)._M_payload.
               super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
               super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload + 0x40) = 0;
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload._M_value.m_deleter =
           tmf::callable<void(),32ul>::
           callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::{lambda(auto:1)#1}::
           callable_base<void>_const__;
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload._M_value.m_caller =
           tmf::callable<void(),32ul>::
           callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::
           {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<void>_const__;
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload._M_value.m_copier =
           auto_tmf::callable<void(),32ul>::callable<responsive_thread()::$_0>(responsive_thread()::
           $_0&&)::{lambda(auto:1&,auto:2_const&)#1}::__invoke<tmf::detail::callable_base<void>,tmf
           ::detail::callable_base<void>>(responsive_thread()::$_0&,tmf::detail::
           callable_base<void>_const__;
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_payload._M_value.m_mover =
           auto_tmf::callable<void(),32ul>::callable<responsive_thread()::$_0>(responsive_thread()::
           $_0&&)::{lambda(auto:1&,auto:2&&)#1}::__invoke<tmf::detail::callable_base<void>,tmf::
           detail::callable_base<void>>(responsive_thread()::$_0&,tmf::detail::
           callable_base<void>___;
      ((__position._M_current)->super__Optional_base<tmf::callable<void_(),_32UL>,_false,_false>).
      _M_payload.super__Optional_payload<tmf::callable<void_(),_32UL>,_true,_false,_false>.
      super__Optional_payload_base<tmf::callable<void_(),_32UL>_>._M_engaged = true;
      *(pointer *)(this + 8) = __position._M_current + 1;
      goto LAB_00102958;
    }
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&handlebars::dispatcher<int>::m_unused_handler_storage_indices,
                          &local_9c);
    uVar2 = (pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1];
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&handlebars::dispatcher<int>::m_unused_handler_storage_indices,
                          &local_9c);
    ppuVar1 = &(pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    this = (vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
            *)std::__detail::
              _Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&handlebars::dispatcher<int>::m_handler_map,&local_9c);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&handlebars::dispatcher<int>::m_handler_map,&local_9c);
    __position._M_current =
         (pmVar4->
         super__Vector_base<std::optional<tmf::callable<void_(),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(),_32UL>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + uVar2;
    __args_1 = *(anon_class_1_0_00000001_for_m_object **)(this + 8);
    __args = extraout_RDX;
    if (__args_1 != *(anon_class_1_0_00000001_for_m_object **)(this + 0x10)) {
      if (__args_1 == (anon_class_1_0_00000001_for_m_object *)__position._M_current) {
        __args_1[0x20] = (anon_class_1_0_00000001_for_m_object)0x0;
        *(code **)(__args_1 + 0x38) =
             tmf::detail::
             member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18),_void_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18)::*)()_const,_void>
             ::anon_class_1_0_00000001_for_m_object::operator();
        *(undefined8 *)(__args_1 + 0x40) = 0;
        *(code **)__args_1 =
             tmf::callable<void(),32ul>::
             callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::{lambda(auto:1)#1}::
             callable_base<void>_const__;
        *(code **)(__args_1 + 8) =
             tmf::callable<void(),32ul>::
             callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::
             {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<void>_const__;
        *(code **)(__args_1 + 0x10) =
             auto_tmf::callable<void(),32ul>::callable<responsive_thread()::$_0>(responsive_thread()
             ::$_0&&)::{lambda(auto:1&,auto:2_const&)#1}::__invoke<tmf::detail::
             callable_base<void>,tmf::detail::callable_base<void>>(responsive_thread()::$_0&,tmf::
             detail::callable_base<void>_const__;
        *(code **)(__args_1 + 0x18) =
             auto_tmf::callable<void(),32ul>::callable<responsive_thread()::$_0>(responsive_thread()
             ::$_0&&)::{lambda(auto:1&,auto:2&&)#1}::__invoke<tmf::detail::callable_base<void>,tmf::
             detail::callable_base<void>>(responsive_thread()::$_0&,tmf::detail::
             callable_base<void>___;
        __args_1[0x50] = (anon_class_1_0_00000001_for_m_object)0x1;
        *(anon_class_1_0_00000001_for_m_object **)(this + 8) = __args_1 + 0x60;
      }
      else {
        local_68 = false;
        local_50 = tmf::detail::
                   member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18),_void_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/example/edgewise/main.cpp:23:18)::*)()_const,_void>
                   ::anon_class_1_0_00000001_for_m_object::operator();
        local_48 = 0;
        local_88 = tmf::callable<void(),32ul>::
                   callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::
                   {lambda(auto:1)#1}::callable_base<void>_const__;
        local_80 = tmf::callable<void(),32ul>::
                   callable<responsive_thread()::$_0>(responsive_thread()::$_0&&)::
                   {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<void>_const__;
        local_78 = auto_tmf::callable<void(),32ul>::callable<responsive_thread()::
                   $_0>(responsive_thread()::$_0&&)::{lambda(auto:1&,auto:2_const&)#1}::__invoke<tmf
                   ::detail::callable_base<void>,tmf::detail::
                   callable_base<void>>(responsive_thread()::$_0&,tmf::detail::
                   callable_base<void>_const__;
        local_70 = auto_tmf::callable<void(),32ul>::callable<responsive_thread()::
                   $_0>(responsive_thread()::$_0&&)::{lambda(auto:1&,auto:2&&)#1}::__invoke<tmf::
                   detail::callable_base<void>,tmf::detail::callable_base<void>>(responsive_thread()
                   ::$_0&,tmf::detail::callable_base<void>___;
        local_38 = true;
        local_98[0] = this;
        std::
        vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
        ::_M_insert_aux<std::optional<tmf::callable<void(),32ul>>>
                  (this,__position,(optional<tmf::callable<void_(),_32UL>_> *)&local_88);
        std::_Optional_payload_base<tmf::callable<void_(),_32UL>_>::_M_reset
                  ((_Optional_payload_base<tmf::callable<void_(),_32UL>_> *)&local_88);
      }
      goto LAB_00102958;
    }
  }
  std::
  vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
  ::_M_realloc_insert<std::in_place_t_const&,responsive_thread()::__0>
            (this,__position,__args,__args_1);
LAB_00102958:
  iVar5 = 100;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    local_98[0] = (vector<std::optional<tmf::callable<void(),32ul>>,std::allocator<std::optional<tmf::callable<void(),32ul>>>>
                   *)CONCAT44(local_98[0]._4_4_,0xd);
    handlebars::dispatcher<int>::push_event<>((int *)local_98);
  }
  while (is_running == true) {
    handlebars::dispatcher<int>::respond(0);
  }
  return;
}

Assistant:

void
responsive_thread()
{
  d::connect(13, [] {
    std::cout << "responding!\n";
    std::this_thread::sleep_for(50ms);
  });
  for (int i = 0; i < 100; ++i) {
    d::push_event(13);
  }
  while (is_running) {
    d::respond();
  }
}